

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
ExpressionRunnerRunAndDispose(ExpressionRunnerRef runner,BinaryenExpressionRef expr)

{
  Expression *pEVar1;
  undefined1 local_68 [8];
  Flow flow;
  
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_68,(ExpressionRunner<wasm::CExpressionRunner> *)runner,expr);
  if ((flow.breakTo.super_IString.str._M_len == 0) &&
     ((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_start -
            flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) / 0x18 +
      (long)local_68 != 0)) {
    pEVar1 = wasm::Flow::getConstExpression
                       ((Flow *)local_68,
                        (runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>).
                        super_ExpressionRunner<wasm::CExpressionRunner>.module);
  }
  else {
    pEVar1 = (BinaryenExpressionRef)0x0;
  }
  wasm::SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_68);
  wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::~ConstantExpressionRunner
            (&runner->super_ConstantExpressionRunner<wasm::CExpressionRunner>);
  operator_delete(runner,0x98);
  return pEVar1;
}

Assistant:

BinaryenExpressionRef
ExpressionRunnerRunAndDispose(ExpressionRunnerRef runner,
                              BinaryenExpressionRef expr) {
  auto* R = (CExpressionRunner*)runner;
  Expression* ret = nullptr;
  try {
    auto flow = R->visit(expr);
    if (!flow.breaking() && !flow.values.empty()) {
      ret = flow.getConstExpression(*R->getModule());
    }
  } catch (NonconstantException&) {
  }
  delete R;
  return ret;
}